

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kirkwood.cpp
# Opt level: O2

void __thiscall OpenMD::Kirkwood::collectHistogram(Kirkwood *this,StuntDouble *sd1,StuntDouble *sd2)

{
  char cVar1;
  uint uVar2;
  pointer pdVar3;
  bool bVar4;
  uint i;
  ulong uVar5;
  double dVar6;
  double dVar7;
  MultipoleAdapter ma2;
  Vector3d d1;
  Vector3d d2;
  MultipoleAdapter ma1;
  Vector3d r12;
  Vector3d pos2;
  Vector3d pos1;
  MultipoleAdapter local_d8;
  Vector<double,_3U> local_d0;
  Vector<double,_3U> local_b8;
  double local_a0;
  Vector<double,_3U> local_98;
  MultipoleAdapter local_80;
  Vector<double,_3U> local_78;
  Vector<double,_3U> local_60;
  Vector<double,_3U> local_48;
  
  if (sd1 != sd2) {
    cVar1 = (((this->super_RadialDistrFunc).super_StaticAnalyser.info_)->simParams_->
            UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b;
    StuntDouble::getPos((Vector3d *)&local_48,sd1);
    StuntDouble::getPos((Vector3d *)&local_60,sd2);
    operator-(&local_b8,&local_60,&local_48);
    Vector<double,_3U>::Vector(&local_78,&local_b8);
    if (cVar1 == '\x01') {
      Snapshot::wrapVector((this->super_RadialDistrFunc).currentSnapshot_,(Vector3d *)&local_78);
    }
    dVar6 = Vector<double,_3U>::length(&local_78);
    local_80.at_ = (AtomType *)sd1[1]._vptr_StuntDouble;
    local_d8.at_ = (AtomType *)sd2[1]._vptr_StuntDouble;
    local_d0.data_[0] = 0.0;
    Vector<double,_3U>::Vector(&local_98,local_d0.data_);
    Vector<double,_3U>::Vector(&local_b8,&local_98);
    local_a0 = 0.0;
    Vector<double,_3U>::Vector(&local_d0,&local_a0);
    Vector<double,_3U>::Vector(&local_98,&local_d0);
    bVar4 = MultipoleAdapter::isDipole(&local_80);
    dVar7 = 0.0;
    if (bVar4) {
      StuntDouble::getDipole((Vector3d *)&local_d0,sd1);
      Vector<double,_3U>::operator=(&local_b8,&local_d0);
      Vector<double,_3U>::normalize(&local_b8);
      bVar4 = MultipoleAdapter::isDipole(&local_d8);
      dVar7 = 0.0;
      if (bVar4) {
        StuntDouble::getDipole((Vector3d *)&local_d0,sd2);
        Vector<double,_3U>::operator=(&local_98,&local_d0);
        Vector<double,_3U>::normalize(&local_98);
        dVar7 = dot<double,3u>(&local_b8,&local_98);
      }
    }
    if (dVar6 < this->len_) {
      uVar2 = (this->super_RadialDistrFunc).super_StaticAnalyser.nBins_;
      pdVar3 = (this->histogram_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (uVar5 = (ulong)(uint)(int)(dVar6 / this->deltaR_); uVar5 < uVar2; uVar5 = uVar5 + 1) {
        pdVar3[uVar5] = pdVar3[uVar5] + dVar7;
      }
    }
  }
  return;
}

Assistant:

void Kirkwood::collectHistogram(StuntDouble* sd1, StuntDouble* sd2) {
    if (sd1 == sd2) { return; }
    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    Vector3d pos1 = sd1->getPos();
    Vector3d pos2 = sd2->getPos();
    Vector3d r12  = pos2 - pos1;
    if (usePeriodicBoundaryConditions_) currentSnapshot_->wrapVector(r12);

    RealType distance = r12.length();

    AtomType* atype1 = static_cast<Atom*>(sd1)->getAtomType();
    AtomType* atype2 = static_cast<Atom*>(sd2)->getAtomType();

    MultipoleAdapter ma1 = MultipoleAdapter(atype1);
    MultipoleAdapter ma2 = MultipoleAdapter(atype2);

    Vector3d d1(0.0);
    Vector3d d2(0.0);
    RealType dotProduct(0.0);

    if (ma1.isDipole()) {
      d1 = sd1->getDipole();
      d1.normalize();
      if (ma2.isDipole()) {
        d2 = sd2->getDipole();
        d2.normalize();
        dotProduct = dot(d1, d2);
      }
    }

    if (distance < len_) {
      int whichBin = int(distance / deltaR_);
      // each dipole pair contributes to all of the radii that contain it.
      for (unsigned int i = whichBin; i < nBins_; i++) {
        histogram_[i] += dotProduct;
      }
    }
  }